

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O1

void __thiscall
btGeneric6DofConstraint::getInfo1NonVirtual(btGeneric6DofConstraint *this,btConstraintInfo1 *info)

{
  int iVar1;
  
  iVar1 = 6;
  if (this->m_useSolveConstraintObsolete != false) {
    iVar1 = 0;
  }
  info->m_numConstraintRows = iVar1;
  info->nub = 0;
  return;
}

Assistant:

void btGeneric6DofConstraint::getInfo1NonVirtual (btConstraintInfo1* info)
{
	if (m_useSolveConstraintObsolete)
	{
		info->m_numConstraintRows = 0;
		info->nub = 0;
	} else
	{
		//pre-allocate all 6
		info->m_numConstraintRows = 6;
		info->nub = 0;
	}
}